

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void OptimizeHuffmanForRle(int length,size_t *counts)

{
  ulong uVar1;
  void *__ptr;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_t *psVar11;
  ulong uVar12;
  
  psVar11 = counts + -1;
  uVar1 = 0xffffffff;
  if (length < -1) {
    uVar1 = (ulong)(uint)length;
  }
  do {
    uVar5 = length;
    if ((int)uVar5 < 0) {
      uVar5 = (uint)uVar1;
      uVar12 = uVar1;
      break;
    }
    if (uVar5 == 0) {
      return;
    }
    uVar12 = (ulong)uVar5;
    length = uVar5 - 1;
  } while (psVar11[uVar12] == 0);
  __ptr = malloc(uVar12 * 4);
  uVar1 = 0;
  uVar3 = 0;
  if (0 < (int)uVar5) {
    uVar3 = (ulong)uVar5;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    *(undefined4 *)((long)__ptr + uVar1 * 4) = 0;
  }
  uVar3 = *counts;
  lVar4 = (long)(int)uVar5;
  lVar2 = (long)__ptr + -4;
  uVar7 = 0;
  uVar1 = uVar3;
  for (uVar6 = 0; (long)uVar6 <= lVar4; uVar6 = uVar6 + 1) {
    if ((uVar6 == uVar12) || (counts[uVar6] != uVar1)) {
      if ((uVar1 == 0 && 4 < (int)uVar7) || (6 < (int)uVar7 && uVar1 != 0)) {
        for (lVar8 = 0; -lVar8 != (ulong)uVar7; lVar8 = lVar8 + -1) {
          *(undefined4 *)(lVar2 + lVar8 * 4) = 1;
        }
      }
      uVar7 = 1;
      if (uVar6 != uVar12) {
        uVar1 = counts[uVar6];
      }
    }
    else {
      uVar7 = uVar7 + 1;
    }
    lVar2 = lVar2 + 4;
  }
  uVar6 = 0;
  uVar1 = 0;
  lVar2 = 0;
  do {
    if (lVar4 < (long)uVar6) {
      free(__ptr);
      return;
    }
    uVar7 = (uint)uVar1;
    if ((uVar6 == uVar12) || (*(int *)((long)__ptr + uVar6 * 4) != 0)) {
LAB_0011e9be:
      if ((3 < (int)uVar7) || ((uVar7 == 3 && (lVar2 == 0)))) {
        uVar3 = ((ulong)(uVar7 >> 1) + lVar2) / uVar1;
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        uVar3 = uVar3 & 0xffffffff;
        if (lVar2 == 0) {
          uVar3 = 0;
        }
        for (lVar2 = 0; -lVar2 != uVar1; lVar2 = lVar2 + -1) {
          psVar11[lVar2] = uVar3;
        }
      }
      if ((long)uVar6 < (long)(int)(uVar5 - 3)) {
        uVar3 = (counts + uVar6 + 2)[1] + (counts + uVar6)[1] + counts[uVar6 + 2] + counts[uVar6] +
                2 >> 2;
      }
      else if ((long)uVar6 < lVar4) {
        uVar3 = counts[uVar6];
      }
      else {
        uVar3 = 0;
      }
      if (uVar6 != uVar12) {
        uVar9 = counts[uVar6];
        uVar1 = 1;
        lVar2 = 0;
        goto LAB_0011ea4a;
      }
      uVar1 = 1;
      lVar2 = 0;
    }
    else {
      uVar9 = counts[uVar6];
      uVar10 = uVar3 - uVar9;
      if (uVar3 < uVar9) {
        uVar10 = -(uVar3 - uVar9);
      }
      if (3 < uVar10) goto LAB_0011e9be;
      uVar1 = (ulong)(uVar7 + 1);
LAB_0011ea4a:
      lVar2 = uVar9 + lVar2;
    }
    uVar6 = uVar6 + 1;
    psVar11 = psVar11 + 1;
  } while( true );
}

Assistant:

void OptimizeHuffmanForRle(int length, size_t* counts) {
  int i, k, stride;
  size_t symbol, sum, limit;
  int* good_for_rle;

  /* 1) We don't want to touch the trailing zeros. We may break the
  rules of the format by adding more data in the distance codes. */
  for (; length >= 0; --length) {
    if (length == 0) {
      return;
    }
    if (counts[length - 1] != 0) {
      /* Now counts[0..length - 1] does not have trailing zeros. */
      break;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
  with an rle code.*/
  good_for_rle = (int*)malloc((unsigned)length * sizeof(int));
  for (i = 0; i < length; ++i) good_for_rle[i] = 0;

  /* Let's not spoil any of the existing good rle codes.
  Mark any seq of 0's that is longer than 5 as a good_for_rle.
  Mark any seq of non-0's that is longer than 7 as a good_for_rle.*/
  symbol = counts[0];
  stride = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || counts[i] != symbol) {
      if ((symbol == 0 && stride >= 5) || (symbol != 0 && stride >= 7)) {
        for (k = 0; k < stride; ++k) {
          good_for_rle[i - k - 1] = 1;
        }
      }
      stride = 1;
      if (i != length) {
        symbol = counts[i];
      }
    } else {
      ++stride;
    }
  }

  /* 3) Let's replace those population counts that lead to more rle codes. */
  stride = 0;
  limit = counts[0];
  sum = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || good_for_rle[i]
        /* Heuristic for selecting the stride ranges to collapse. */
        || AbsDiff(counts[i], limit) >= 4) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        /* The stride must end, collapse what we have, if we have enough (4). */
        int count = (sum + stride / 2) / stride;
        if (count < 1) count = 1;
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
          that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 3) {
        /* All interesting strides have a count of at least 4,
        at least when non-zeros. */
        limit = (counts[i] + counts[i + 1] +
                 counts[i + 2] + counts[i + 3] + 2) / 4;
      } else if (i < length) {
        limit = counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
    }
  }

  free(good_for_rle);
}